

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

Object * resolveExpression(Object *__return_storage_ptr__,Expression *expression,Environment *env)

{
  undefined1 uVar1;
  TokenType TVar2;
  Expression *pEVar3;
  Expression *expression_00;
  int iVar4;
  Object *pOVar5;
  Instance *pIVar6;
  size_t sVar7;
  Object *pOVar8;
  ulong uVar9;
  size_t sVar10;
  LiteralType LVar11;
  ulong uVar12;
  ulong uVar13;
  LiteralType LVar14;
  ulong uVar15;
  uint uVar16;
  char *pcVar17;
  bool bVar18;
  bool bVar19;
  anon_union_8_4_50a03f35_for_Literal_2 aVar20;
  double dVar21;
  anon_union_8_4_50a03f35_for_Literal_2 aVar22;
  anon_union_8_4_50a03f35_for_Literal_2 aVar23;
  Literal LVar24;
  Literal LVar25;
  Object a;
  Object local_b0;
  Object local_70;
  
  pOVar8 = (Object *)(ulong)expression->type;
  if ((Object *)0x7 < pOVar8) {
    return pOVar8;
  }
  pOVar5 = (Object *)
           ((long)&switchD_00105376::switchdataD_00108c64 +
           (long)(int)(&switchD_00105376::switchdataD_00108c64)[(long)pOVar8]);
  switch(pOVar8) {
  case (Object *)0x0:
    uVar16 = (expression->field_1).binary.line;
    uVar9 = (ulong)uVar16;
    TVar2 = (expression->field_1).binary.op.type;
    pEVar3 = (expression->field_1).binary.right;
    LVar24 = resolveLiteral((expression->field_1).binary.left,uVar16,env);
    aVar20 = LVar24.field_2;
    pIVar6 = LVar24._0_8_;
    LVar25 = resolveLiteral(pEVar3,uVar16,env);
    aVar23 = LVar25.field_2;
    uVar12 = LVar25._0_8_ >> 0x20;
    if (TVar2 == TOKEN_PLUS && (uVar12 == 2 && (ulong)pIVar6 >> 0x20 == 2)) {
      sVar10 = strlen(aVar20.sVal);
      sVar7 = strlen(aVar23.sVal);
      pcVar17 = (char *)malloc(sVar10 + sVar7 + 1);
      *pcVar17 = '\0';
      strcat(pcVar17,aVar20.sVal);
      pOVar8 = (Object *)strcat(pcVar17,aVar23.sVal);
      __return_storage_ptr__->type = OBJECT_LITERAL;
      (__return_storage_ptr__->field_1).instance = (Instance *)(uVar9 | 0x200000000);
      (__return_storage_ptr__->field_1).routine.name = pcVar17;
      return pOVar8;
    }
    if ((((ulong)pIVar6 >> 0x20 & 0xfffffffe) != 0) ||
       (uVar12 != 0 && (LVar25._0_8_ & 0xffffffff00000000) != 0x100000000)) {
      pcVar17 = 
      "\x1b[31m\n[Runtime Error] [Line:%d] Binary operation can only be done on numerical values!\x1b[0m"
      ;
      goto LAB_00105baf;
    }
    if ((LVar24.type == LIT_INT) && (LVar25.type == LIT_INT)) {
      pOVar5 = (Object *)0x0;
      switch(TVar2) {
      case TOKEN_MINUS:
        pOVar5 = (Object *)(aVar20.sVal + -aVar23.iVal);
        break;
      case TOKEN_PLUS:
        pOVar5 = (Object *)(aVar23.sVal + (long)aVar20.sVal);
        break;
      case TOKEN_SLASH:
        pOVar5 = (Object *)(aVar20.iVal / aVar23.iVal);
        break;
      case TOKEN_STAR:
        pOVar5 = (Object *)(aVar23.iVal * aVar20.iVal);
        break;
      case TOKEN_PERCEN:
        pOVar5 = (Object *)(aVar20.iVal % aVar23.iVal);
        break;
      case TOKEN_CARET:
        dVar21 = pow((double)aVar20.iVal,(double)aVar23.iVal);
        pOVar5 = (Object *)(long)dVar21;
      }
    }
    else {
      if (LVar24.type == LIT_INT) {
        aVar20.dVal = (double)aVar20.iVal;
      }
      pIVar6 = (Instance *)((ulong)pIVar6 & 0xffffffff);
      if (LVar25.type == LIT_INT) {
        aVar23.dVal = (double)aVar23.iVal;
      }
      pOVar5 = (Object *)0x0;
      switch(TVar2) {
      case TOKEN_MINUS:
        pOVar5 = (Object *)(aVar20.dVal - aVar23.dVal);
        break;
      case TOKEN_PLUS:
        pOVar5 = (Object *)(aVar20.dVal + aVar23.dVal);
        break;
      case TOKEN_SLASH:
        pOVar5 = (Object *)(aVar20.dVal / aVar23.dVal);
        break;
      case TOKEN_STAR:
        pOVar5 = (Object *)(aVar20.dVal * aVar23.dVal);
        break;
      case TOKEN_PERCEN:
        pcVar17 = 
        "\x1b[31m\n[Runtime Error] [Line:%d] %% can only be applied between two integers!\x1b[0m";
        goto LAB_00105bd8;
      case TOKEN_CARET:
        pOVar5 = (Object *)pow(aVar20.dVal,aVar23.dVal);
      }
    }
    __return_storage_ptr__->type = OBJECT_LITERAL;
    (__return_storage_ptr__->field_1).instance = pIVar6;
LAB_00105acb:
    (__return_storage_ptr__->field_1).arr.values = pOVar5;
    break;
  case (Object *)0x1:
    uVar16 = (expression->field_1).binary.line;
    uVar9 = (ulong)uVar16;
    pEVar3 = (expression->field_1).binary.left;
    TVar2 = (expression->field_1).binary.op.type;
    expression_00 = (expression->field_1).binary.right;
    resolveExpression(&local_b0,pEVar3,env);
    resolveExpression(&local_70,expression_00,env);
    if ((local_b0.type ^ OBJECT_INSTANCE) == OBJECT_NULL &&
        (local_70.type ^ OBJECT_INSTANCE) == OBJECT_NULL) {
      if (TVar2 == TOKEN_BANG_EQUAL) {
        bVar19 = (Instance *)CONCAT44(local_b0.field_1.literal.type,local_b0.field_1.literal.line)
                 != local_70.field_1.instance;
LAB_0010584e:
        __return_storage_ptr__->type = OBJECT_LITERAL;
        (__return_storage_ptr__->field_1).instance = (Instance *)(uVar9 | 0x300000000);
        *(Object **)((long)&__return_storage_ptr__->field_1 + 8) = (Object *)(ulong)bVar19;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
        (__return_storage_ptr__->field_1).routine.arguments = (char **)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
        return (Object *)(ulong)bVar19;
      }
      if (TVar2 == TOKEN_EQUAL_EQUAL) {
        bVar19 = (Instance *)CONCAT44(local_b0.field_1.literal.type,local_b0.field_1.literal.line)
                 == local_70.field_1.instance;
        goto LAB_0010584e;
      }
      pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Can\'t compare container instances!\x1b[0m";
      goto LAB_00105baf;
    }
    if (((local_b0.type ^ OBJECT_INSTANCE) == OBJECT_NULL && local_70.type == OBJECT_LITERAL) ||
       (local_b0.type == OBJECT_LITERAL && (local_70.type ^ OBJECT_INSTANCE) == OBJECT_NULL)) {
      pOVar8 = &local_70;
      if (local_b0.type == OBJECT_LITERAL) {
        pOVar8 = &local_b0;
      }
      pOVar5 = &local_70;
      if (local_b0.type == OBJECT_INSTANCE) {
        pOVar5 = &local_b0;
      }
      if ((pOVar8->field_1).literal.type == LIT_NULL) {
        if (TVar2 == TOKEN_BANG_EQUAL) {
          bVar19 = (pOVar5->field_1).instance != (Instance *)0x0;
          goto LAB_0010584e;
        }
        if (TVar2 == TOKEN_EQUAL_EQUAL) {
          bVar19 = (pOVar5->field_1).instance == (Instance *)0x0;
          goto LAB_0010584e;
        }
        pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Null can\'t be compared!\x1b[0m";
      }
      else {
        pcVar17 = 
        "\x1b[31m\n[Runtime Error] [Line:%d] Unable to compare between literal and instances!\x1b[0m"
        ;
      }
      goto LAB_00105baf;
    }
    LVar24 = resolveLiteral(pEVar3,uVar16,env);
    aVar20 = LVar24.field_2;
    uVar12 = LVar24._0_8_;
    LVar25 = resolveLiteral(expression_00,uVar16,env);
    aVar23 = LVar25.field_2;
    uVar15 = uVar12 >> 0x20;
    uVar13 = LVar25._0_8_ >> 0x20;
    if ((uVar15 == 4) || (LVar11 = LVar25.type, LVar11 == LIT_NULL)) {
      uVar12 = uVar9;
      if (TVar2 == TOKEN_BANG_EQUAL) {
        bVar19 = uVar13 != 4 || uVar15 != 4;
      }
      else if (TVar2 == TOKEN_EQUAL_EQUAL) {
        bVar19 = uVar15 == 4 && uVar13 == 4;
      }
      else {
        bVar19 = false;
        printf("\x1b[31m\n[Runtime Error] [Line:%d] Unable to compare Null!\x1b[0m",uVar9);
      }
LAB_00105ac1:
      pOVar5 = (Object *)(ulong)bVar19;
      __return_storage_ptr__->type = OBJECT_LITERAL;
      (__return_storage_ptr__->field_1).instance = (Instance *)(uVar12 | 0x300000000);
      goto LAB_00105acb;
    }
    LVar14 = LVar24.type;
    if ((LVar14 == LIT_STRING) && (LVar11 == LIT_STRING)) {
      switch(TVar2) {
      case TOKEN_BANG_EQUAL:
        iVar4 = strcmp(aVar20.sVal,aVar23.sVal);
        bVar19 = iVar4 != 0;
        break;
      default:
        goto switchD_00105730_caseD_8;
      case TOKEN_EQUAL_EQUAL:
        iVar4 = strcmp(aVar20.sVal,aVar23.sVal);
        bVar19 = iVar4 == 0;
        break;
      case TOKEN_GREATER:
        sVar10 = strlen(aVar20.sVal);
        sVar7 = strlen(aVar23.sVal);
        bVar19 = sVar7 < sVar10;
        break;
      case TOKEN_GREATER_EQUAL:
        sVar10 = strlen(aVar20.sVal);
        sVar7 = strlen(aVar23.sVal);
        bVar19 = sVar7 <= sVar10;
        break;
      case TOKEN_LESS:
        sVar10 = strlen(aVar20.sVal);
        sVar7 = strlen(aVar23.sVal);
        bVar19 = sVar10 < sVar7;
        break;
      case TOKEN_LESS_EQUAL:
        sVar10 = strlen(aVar20.sVal);
        sVar7 = strlen(aVar23.sVal);
        bVar19 = sVar10 <= sVar7;
      }
      goto LAB_00105ac1;
    }
    if ((((LVar14 != LIT_LOGICAL) && (uVar15 != 0)) &&
        ((uVar12 & 0xffffffff00000000) != 0x100000000)) ||
       (((LVar11 != LIT_LOGICAL && (uVar13 != 0)) &&
        ((LVar25._0_8_ & 0xffffffff00000000) != 0x100000000)))) {
      pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Bad operand for logical operator!\x1b[0m";
LAB_00105bd8:
      do {
        printf(pcVar17,uVar9);
        stop();
switchD_00105730_caseD_8:
        pcVar17 = 
        "\x1b[31m\n[Runtime Error] [Line:%d] Bad logical operator between string operands!\x1b[0m";
      } while( true );
    }
    aVar22.iVal = aVar20.iVal;
    if (LVar14 == LIT_INT) {
      aVar22.dVal = (double)aVar20.iVal;
    }
    if (LVar11 == LIT_INT) {
      aVar23.dVal = (double)aVar23.iVal;
    }
    switch(TVar2) {
    case TOKEN_BANG_EQUAL:
      bVar19 = ABS(aVar22.dVal - aVar23.dVal) == 1e-25;
      bVar18 = ABS(aVar22.dVal - aVar23.dVal) < 1e-25;
      goto LAB_00105b1b;
    case TOKEN_COMMA:
    case TOKEN_DOT:
    case TOKEN_COLON:
    case TOKEN_EQUAL:
      break;
    case TOKEN_EQUAL_EQUAL:
      aVar22.dVal = ABS(aVar22.dVal - aVar23.dVal);
      aVar23.sVal = (char *)0x3abef2d0f5da7dd9;
    case TOKEN_LESS_EQUAL:
      bVar19 = aVar23.dVal < aVar22.dVal;
LAB_00105b0e:
      aVar20.iVal._1_7_ = 0;
      aVar20.lVal._0_1_ = !bVar19;
      break;
    case TOKEN_GREATER:
      bVar19 = aVar22.dVal == aVar23.dVal;
      bVar18 = aVar22.dVal < aVar23.dVal;
      goto LAB_00105b1b;
    case TOKEN_GREATER_EQUAL:
      bVar19 = aVar22.dVal < aVar23.dVal;
      goto LAB_00105b0e;
    case TOKEN_LESS:
      bVar19 = aVar23.dVal == aVar22.dVal;
      bVar18 = aVar23.dVal < aVar22.dVal;
LAB_00105b1b:
      aVar20.iVal._1_7_ = 0;
      aVar20.lVal._0_1_ = !bVar18 && !bVar19;
      break;
    default:
      if (TVar2 == TOKEN_AND) {
        if ((LVar14 != LIT_LOGICAL) || (LVar11 != LIT_LOGICAL)) {
          pcVar17 = 
          "\x1b[31m\n[Runtime Error] [Line:%d] \'And\' can only be applied over logical expressions!\x1b[0m"
          ;
          goto LAB_00105bd8;
        }
        aVar20._0_4_ = LVar24.field_2._0_4_ & LVar25.field_2._0_4_;
        aVar20.iVal._4_4_ = 0;
      }
      else if (TVar2 == TOKEN_OR) {
        if ((LVar14 != LIT_LOGICAL) || (LVar11 != LIT_LOGICAL)) {
          pcVar17 = 
          "\x1b[31m\n[Runtime Error] [Line:%d] \'Or\' can only be applied over logical expressions!\x1b[0m"
          ;
          goto LAB_00105bd8;
        }
        aVar20._0_4_ = LVar24.field_2._0_4_ | LVar25.field_2._0_4_;
        aVar20.iVal._4_4_ = 0;
      }
    }
    pOVar5 = (Object *)0x300000000;
    __return_storage_ptr__->type = OBJECT_LITERAL;
    (__return_storage_ptr__->field_1).instance = (Instance *)(uVar12 | 0x300000000);
    ((anon_union_8_4_50a03f35_for_Literal_2 *)((long)&__return_storage_ptr__->field_1 + 8))->dVal =
         (double)aVar20;
    break;
  case (Object *)0x2:
    __return_storage_ptr__->type = OBJECT_LITERAL;
    aVar20 = (anon_union_8_4_50a03f35_for_Literal_2)(expression->field_1).binary.left;
    (__return_storage_ptr__->field_1).instance = *(Instance **)&expression->field_1;
    (__return_storage_ptr__->field_1).literal.field_2 = aVar20;
    break;
  case (Object *)0x3:
    pOVar8 = env_get(__return_storage_ptr__,(expression->field_1).variable.name,
                     (expression->field_1).binary.line,env);
    return pOVar8;
  case (Object *)0x4:
    uVar16 = (expression->field_1).binary.line;
    pcVar17 = (expression->field_1).arrayExpression.identifier;
    LVar24 = resolveLiteral((expression->field_1).binary.left,uVar16,env);
    if (LVar24.type == LIT_INT) {
      env_get(&local_b0,pcVar17,uVar16,env);
      if ((local_b0.type != OBJECT_LITERAL) || (local_b0.field_1.literal.type != LIT_STRING)) {
        pOVar8 = env_arr_get(__return_storage_ptr__,pcVar17,uVar16,LVar24.field_2.iVal,env);
        return pOVar8;
      }
      sVar10 = strlen(local_b0.field_1.routine.name);
      pOVar8 = (Object *)(long)LVar24.field_2._0_4_;
      if (0 < (long)pOVar8) {
        pOVar5 = (Object *)(sVar10 + 1);
        if ((long)pOVar8 <= (long)pOVar5) {
          if (pOVar8 != pOVar5) {
            uVar1 = ((undefined1 *)((long)&local_b0.field_1.arr.values[-1].field_1 + 0x37))
                    [(long)pOVar8];
            pOVar5 = (Object *)malloc(2);
            *(undefined1 *)&pOVar5->type = uVar1;
            *(byte *)((long)&pOVar5->type + 1) = 0;
            __return_storage_ptr__->type = OBJECT_LITERAL;
            (__return_storage_ptr__->field_1).instance = (Instance *)0x200000000;
            goto LAB_00105acb;
          }
          goto switchD_00105376_caseD_7;
        }
      }
      printf("\x1b[31m\n[Runtime Error] [Line:%d] String index out of range [%ld]!\x1b[0m",
             (ulong)uVar16);
      goto LAB_00105bb6;
    }
    pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Array index must be an integer!\x1b[0m";
    goto LAB_00105b66;
  case (Object *)0x5:
    pOVar5 = resolveCall(__return_storage_ptr__,(expression->field_1).callExpression,env);
    break;
  case (Object *)0x6:
    uVar16 = (expression->field_1).binary.line;
    pEVar3 = (expression->field_1).referenceExpression.member;
    resolveExpression(&local_b0,(expression->field_1).binary.left,env);
    if (local_b0.type == OBJECT_INSTANCE) {
      pOVar8 = resolveExpression(__return_storage_ptr__,pEVar3,
                                 *(Environment **)
                                  (CONCAT44(local_b0.field_1.literal.type,
                                            local_b0.field_1.literal.line) + 0x18));
      return pOVar8;
    }
    pcVar17 = "\x1b[31m\n[Runtime Error] [Line:%d] Invalid member reference!\x1b[0m";
LAB_00105b66:
    uVar9 = (ulong)uVar16;
LAB_00105baf:
    printf(pcVar17,uVar9);
LAB_00105bb6:
    putchar(10);
    unload_all();
    exit(1);
  case (Object *)0x7:
switchD_00105376_caseD_7:
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
    (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
    __return_storage_ptr__->type = OBJECT_NULL;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
  }
  return pOVar5;
}

Assistant:

static Object resolveExpression(Expression* expression, Environment *env){
    //   printf("\nSolving expression : %s", expressionNames[expression->type]);
    switch(expression->type){
        case EXPR_LITERAL:
            return fromLiteral(expression->literal);
        case EXPR_BINARY:
            return resolveBinary(expression->binary, env);
        case EXPR_LOGICAL:
            return resolveLogical(expression->logical, env);
        case EXPR_NONE:
            return nullObject;
        case EXPR_VARIABLE:
            return resolveVariable(expression->variable, env);
        case EXPR_ARRAY:
            return resolveArray(expression->arrayExpression, env);
        case EXPR_CALL:
            return resolveCall(expression->callExpression, env);
        case EXPR_REFERENCE:
            return resolveReference(expression->referenceExpression, env);
    }
}